

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_sharing.cpp
# Opt level: O3

void benchmarkSharing<FarApart>(void)

{
  undefined4 local_b0 [2];
  FarApart t;
  thread local_20;
  thread t1;
  thread t2;
  
  local_b0[0] = 1;
  t.c[0x78] = '\x01';
  t.c[0x79] = '\0';
  t.c[0x7a] = '\0';
  t.c[0x7b] = '\0';
  t1._M_id._M_thread = (id)(id)local_b0;
  std::thread::thread<void(&)(FarApart*),FarApart*,void>(&local_20,readA<FarApart>,(FarApart **)&t1)
  ;
  t._128_8_ = local_b0;
  std::thread::thread<void(&)(FarApart*),FarApart*,void>
            (&t1,writeB<FarApart>,(FarApart **)(t.c + 0x7c));
  std::thread::join();
  std::thread::join();
  if ((t1._M_id._M_thread == 0) && (local_20._M_id._M_thread == 0)) {
    return;
  }
  std::terminate();
}

Assistant:

void benchmarkSharing() {
  T t;
  t.a = 1;
  t.b = 1;
  std::thread t1(readA<T>, &t);
  std::thread t2(writeB<T>, &t);
  t1.join();
  t2.join();
}